

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double find_split_rel_gain_weighted_t<double,double,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>>
                 (double *x,double xmean,size_t *ix_arr,size_t st,size_t end,double *split_point,
                 size_t *split_ix,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  ulong uVar1;
  size_t row;
  size_t sVar2;
  size_t *psVar3;
  size_t *key;
  double dVar4;
  double dVar5;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar6;
  tuple<> local_79;
  double local_78;
  double local_70;
  double local_68;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_60;
  double local_58;
  double *local_50;
  size_t *local_48;
  double local_40;
  double local_38;
  
  *split_ix = 0;
  local_70 = 0.0;
  local_58 = xmean;
  local_50 = split_point;
  local_48 = split_ix;
  if (st <= end) {
    psVar3 = ix_arr + st;
    sVar2 = st;
    do {
      local_60._M_head_impl = psVar3;
      pVar6 = tsl::detail_robin_hash::
              robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
              ::
              insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                        ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                          *)w,psVar3,(piecewise_construct_t *)&std::piecewise_construct,
                         (tuple<const_unsigned_long_&> *)&local_60,&local_79);
      local_70 = local_70 + *(double *)((pVar6.first.m_bucket.m_bucket)->m_value + 8);
      sVar2 = sVar2 + 1;
      psVar3 = psVar3 + 1;
    } while (sVar2 <= end);
  }
  psVar3 = local_48;
  local_40 = 0.0;
  uVar1 = st;
  if (st <= end) {
    do {
      local_40 = local_40 + (x[ix_arr[uVar1]] - local_58);
      uVar1 = uVar1 + 1;
    } while (uVar1 <= end);
  }
  local_78 = -INFINITY;
  if (st < end) {
    key = ix_arr + st;
    local_78 = -INFINITY;
    dVar4 = 0.0;
    local_68 = 0.0;
    do {
      local_60._M_head_impl = key;
      local_38 = dVar4;
      pVar6 = tsl::detail_robin_hash::
              robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
              ::
              insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                        ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                          *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                         (tuple<const_unsigned_long_&> *)&local_60,&local_79);
      local_68 = local_68 + *(double *)((pVar6.first.m_bucket.m_bucket)->m_value + 8);
      dVar5 = x[ix_arr[st]];
      dVar4 = (dVar5 - local_58) + local_38;
      if (((dVar5 != x[ix_arr[st + 1]]) || (NAN(dVar5) || NAN(x[ix_arr[st + 1]]))) &&
         (dVar5 = (dVar4 / local_68) * dVar4 +
                  ((local_40 - dVar4) / (local_70 - local_68)) * (local_40 - dVar4),
         local_78 < dVar5)) {
        *psVar3 = st;
        local_78 = dVar5;
      }
      st = st + 1;
      key = key + 1;
    } while (end != st);
  }
  if (-INFINITY < local_78) {
    sVar2 = *psVar3;
    local_70 = x[ix_arr[sVar2]];
    local_68 = x[ix_arr[sVar2 + 1]];
    dVar4 = (local_68 - local_70) * 0.5 + local_70;
    if ((local_68 <= dVar4) &&
       ((dVar4 = nextafter(dVar4,local_68), dVar4 <= local_70 || (local_68 <= dVar4)))) {
      dVar4 = local_70;
    }
    *local_50 = dVar4;
    if (local_78 <= 2.220446049250313e-16) {
      local_78 = 2.220446049250313e-16;
    }
  }
  return local_78;
}

Assistant:

double find_split_rel_gain_weighted_t(real_t_ *restrict x, real_t_ xmean, size_t *restrict ix_arr, size_t st, size_t end, double &split_point, size_t &restrict split_ix, mapping &restrict w)
{
    real_t this_gain;
    real_t best_gain = -HUGE_VAL;
    split_ix = 0; /* <- avoid out-of-bounds at the end */
    real_t sum_left = 0, sum_right = 0, sum_tot = 0, sumw = 0, sumw_tot = 0;

    for (size_t row = st; row <= end; row++)
        sumw_tot += w[ix_arr[row]];
    for (size_t row = st; row <= end; row++)
        sum_tot += x[ix_arr[row]] - xmean;
    for (size_t row = st; row < end; row++)
    {
        sumw += w[ix_arr[row]];
        sum_left += x[ix_arr[row]] - xmean;
        if (x[ix_arr[row]] == x[ix_arr[row+1]])
            continue;

        sum_right = sum_tot - sum_left;
        this_gain =   sum_left  * (sum_left  / sumw)
                    + sum_right * (sum_right / (sumw_tot - sumw));
        if (this_gain > best_gain)
        {
            best_gain = this_gain;
            split_ix = row;
        }
    }

    if (best_gain <= -HUGE_VAL)
        return best_gain;
    split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);
    return std::fmax((double)best_gain, std::numeric_limits<double>::epsilon());
}